

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O0

void __thiscall Rml::Style::ComputedValues::ComputedValues(ComputedValues *this,Element *element)

{
  Element *element_local;
  ComputedValues *this_local;
  
  NonCopyMoveable::NonCopyMoveable((NonCopyMoveable *)this);
  this->element = element;
  CommonValues::CommonValues(&this->common);
  InheritedValues::InheritedValues(&this->inherited);
  RareValues::RareValues(&this->rare);
  return;
}

Assistant:

explicit ComputedValues(Element* element) : element(element) {}